

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::basic_string_view<char,std::char_traits<char>>&>,std::tuple<std::pair<unsigned_long,unsigned_long>&&>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<std::basic_string_view<char,_std::char_traits<char>_>_&> *args_1,
          tuple<std::pair<unsigned_long,_unsigned_long>_&&> *args_2)

{
  size_t c;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  pair<unsigned_long,_unsigned_long> *ppVar2;
  char *pcVar3;
  size_t sVar4;
  unsigned_long uVar5;
  bool bVar6;
  reference key;
  anon_union_8_1_a8a14541_for_iterator_2 aVar7;
  iterator local_58;
  iterator local_48;
  iterator local_38;
  
  aVar7 = iter.field_1;
  local_48.ctrl_ = iter.ctrl_;
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  pbVar1 = (args_1->super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&>)
           .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&,_false>.
           _M_head_impl;
  ppVar2 = (args_2->super__Tuple_impl<0UL,_std::pair<unsigned_long,_unsigned_long>_&&>).
           super__Head_base<0UL,_std::pair<unsigned_long,_unsigned_long>_&&,_false>._M_head_impl;
  pcVar3 = pbVar1->_M_str;
  sVar4 = pbVar1->_M_len;
  *(string **)aVar7.slot_ = (string *)((long)aVar7.slot_ + 0x10);
  local_48.field_1 = aVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)aVar7.slot_,pcVar3,pcVar3 + sVar4);
  uVar5 = ppVar2->second;
  *(unsigned_long *)((long)aVar7.slot_ + 0x20) = ppVar2->first;
  *(unsigned_long *)((long)aVar7.slot_ + 0x28) = uVar5;
  CommonFields::set_capacity((CommonFields *)this,c);
  key = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::iterator::operator*(&local_48);
  local_38 = find<std::__cxx11::string>(this,&key->first);
  local_58.ctrl_ = local_48.ctrl_;
  local_58.field_1.slot_ = (slot_type *)local_48.field_1;
  bVar6 = container_internal::operator==(&local_38,&local_58);
  if (bVar6) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>, Args = <const std::piecewise_construct_t &, std::tuple<std::basic_string_view<char> &>, std::tuple<std::pair<unsigned long, unsigned long> &&>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }